

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SizeRange::SerializeWithCachedSizes
          (SizeRange *this,CodedOutputStream *output)

{
  uint64 uVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SizeRange *this_local;
  
  uVar1 = lowerbound(this);
  if (uVar1 != 0) {
    uVar1 = lowerbound(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  iVar2 = upperbound(this);
  if (iVar2 != 0) {
    iVar2 = upperbound(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar2,output);
  }
  return;
}

Assistant:

void SizeRange::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SizeRange)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 lowerBound = 1;
  if (this->lowerbound() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->lowerbound(), output);
  }

  // int64 upperBound = 2;
  if (this->upperbound() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->upperbound(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SizeRange)
}